

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>::
BindResources(ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
              *this,IResourceMapping *pResourceMapping,BIND_SHADER_RESOURCES_FLAGS Flags)

{
  BIND_SHADER_RESOURCES_FLAGS BVar1;
  Char *Message;
  uint local_50;
  Uint32 v;
  undefined1 local_40 [8];
  string msg;
  BIND_SHADER_RESOURCES_FLAGS Flags_local;
  IResourceMapping *pResourceMapping_local;
  ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
  *this_local;
  
  msg.field_2._12_4_ = Flags;
  if (pResourceMapping == (IResourceMapping *)0x0) {
    FormatString<char[51]>
              ((string *)local_40,
               (char (*) [51])"Failed to bind resources: resource mapping is null");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"BindResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x362);
    std::__cxx11::string::~string((string *)local_40);
  }
  BVar1 = Diligent::operator&(msg.field_2._12_4_,BIND_SHADER_RESOURCES_UPDATE_ALL);
  if (BVar1 == 0) {
    Diligent::operator|=
              ((BIND_SHADER_RESOURCES_FLAGS *)(msg.field_2._M_local_buf + 0xc),
               BIND_SHADER_RESOURCES_UPDATE_ALL);
  }
  for (local_50 = 0; local_50 < *(uint *)&this[1].m_Owner; local_50 = local_50 + 1) {
    ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
    ::BindResources(&this->m_pVariables[local_50].
                     super_ShaderVariableBase<Diligent::ShaderVariableVkImpl,_Diligent::ShaderVariableManagerVk,_Diligent::IShaderResourceVariable>
                    ,pResourceMapping,msg.field_2._12_4_);
  }
  return;
}

Assistant:

void BindResources(IResourceMapping* pResourceMapping, BIND_SHADER_RESOURCES_FLAGS Flags)
    {
        DEV_CHECK_ERR(pResourceMapping != nullptr, "Failed to bind resources: resource mapping is null");

        if ((Flags & BIND_SHADER_RESOURCES_UPDATE_ALL) == 0)
            Flags |= BIND_SHADER_RESOURCES_UPDATE_ALL;

        for (Uint32 v = 0; v < static_cast<ThisImplType*>(this)->m_NumVariables; ++v)
        {
            m_pVariables[v].BindResources(pResourceMapping, Flags);
        }
    }